

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O1

size_t __thiscall
cappuccino::tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::
insert_range<std::vector<std::tuple<std::chrono::duration<long,std::ratio<60l,1l>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::chrono::duration<long,std::ratio<60l,1l>>,unsigned_long,std::__cxx11::string>>>>
          (tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1> *this,
          vector<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *key_value_range,allow a)

{
  pointer ptVar1;
  bool bVar2;
  int iVar3;
  time_point now;
  undefined8 uVar4;
  size_t sVar5;
  _Head_base<1UL,_unsigned_long,_false> *key;
  pointer ptVar6;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    _Unwind_Resume(uVar4);
  }
  ptVar6 = (key_value_range->
           super__Vector_base<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (key_value_range->
           super__Vector_base<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar6 == ptVar1) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    key = &(ptVar6->
           super__Tuple_impl<0UL,_std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Head_base<1UL,_unsigned_long,_false>;
    do {
      bVar2 = tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
              ::do_insert_update((tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                                  *)this,&key->_M_head_impl,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(key + -4),now,
                                 (time_point)(*(long *)(key + 1) * 60000000000 + (long)now.__d.__r),
                                 a);
      sVar5 = sVar5 + bVar2;
      ptVar6 = (pointer)(key + 2);
      key = key + 6;
    } while (ptVar6 != ptVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return sVar5;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        auto   now = std::chrono::steady_clock::now();
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [ttl, key, value] : key_value_range)
            {
                auto expired_time = now + ttl;
                if (do_insert_update(key, std::move(value), now, expired_time, a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }